

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  BVH *bvh;
  NodeRef root;
  undefined1 auVar7 [16];
  uint uVar8;
  uint uVar9;
  uint uVar10;
  size_t k;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar17;
  int iVar18;
  undefined4 uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar24;
  uint uVar25;
  ulong uVar26;
  NodeRef *pNVar27;
  bool bVar28;
  vint4 ai_2;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar34;
  undefined1 in_ZMM0 [64];
  vint4 ai;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 bi_3;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi_2;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 bi_1;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 ai_1;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  vint4 ai_3;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vint4 bi;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  Precalculations pre;
  vbool<4> terminated;
  float local_36f8;
  float fStack_36f4;
  float fStack_36f0;
  float fStack_36ec;
  float local_36e8;
  float fStack_36e4;
  float fStack_36e0;
  float fStack_36dc;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  auVar7 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar44 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar45 = vpcmpeqd_avx(auVar44,(undefined1  [16])valid_i->field_0);
    auVar40 = ZEXT816(0) << 0x40;
    auVar41 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar40,5);
    auVar49 = auVar45 & auVar41;
    if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar49[0xf] < '\0')
    {
      auVar41 = vandps_avx(auVar41,auVar45);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar72._8_4_ = 0x7fffffff;
      auVar72._0_8_ = 0x7fffffff7fffffff;
      auVar72._12_4_ = 0x7fffffff;
      auVar45 = vandps_avx(auVar72,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar67._8_4_ = 0x219392ef;
      auVar67._0_8_ = 0x219392ef219392ef;
      auVar67._12_4_ = 0x219392ef;
      auVar45 = vcmpps_avx(auVar45,auVar67,1);
      auVar49 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar67,auVar45);
      auVar45 = vandps_avx(auVar72,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar45 = vcmpps_avx(auVar45,auVar67,1);
      auVar50 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar67,auVar45);
      auVar45 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar72);
      auVar45 = vcmpps_avx(auVar45,auVar67,1);
      auVar45 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar67,auVar45);
      auVar55 = vrcpps_avx(auVar49);
      auVar68._8_4_ = 0x3f800000;
      auVar68._0_8_ = &DAT_3f8000003f800000;
      auVar68._12_4_ = 0x3f800000;
      auVar49 = vfnmadd213ps_fma(auVar49,auVar55,auVar68);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar49,auVar55,auVar55)
      ;
      auVar49 = vrcpps_avx(auVar50);
      auVar50 = vfnmadd213ps_fma(auVar50,auVar49,auVar68);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar50,auVar49,auVar49)
      ;
      auVar49 = vrcpps_avx(auVar45);
      auVar45 = vfnmadd213ps_fma(auVar45,auVar49,auVar68);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar45,auVar49,auVar49)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * (float)tray.org.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * (float)tray.org.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * (float)tray.org.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * (float)tray.org.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar45 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar40,1);
      auVar49._8_4_ = 0x20;
      auVar49._0_8_ = 0x2000000020;
      auVar49._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar45,auVar49);
      auVar45 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar40,5);
      auVar50._8_4_ = 0x40;
      auVar50._0_8_ = 0x4000000040;
      auVar50._12_4_ = 0x40;
      auVar55._8_4_ = 0x60;
      auVar55._0_8_ = 0x6000000060;
      auVar55._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar55,auVar50,auVar45);
      auVar45 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar40,5);
      auVar56._8_4_ = 0x80;
      auVar56._0_8_ = 0x8000000080;
      auVar56._12_4_ = 0x80;
      auVar59._8_4_ = 0xa0;
      auVar59._0_8_ = 0xa0000000a0;
      auVar59._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar59,auVar56,auVar45);
      auVar45 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar40);
      auVar49 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar70 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar45,auVar41);
      auVar45._8_4_ = 0xff800000;
      auVar45._0_8_ = 0xff800000ff800000;
      auVar45._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar45,auVar49,auVar41);
      terminated.field_0.i[1] = auVar41._4_4_ ^ auVar44._4_4_;
      terminated.field_0.i[0] = auVar41._0_4_ ^ auVar44._0_4_;
      terminated.field_0.i[2] = auVar41._8_4_ ^ auVar44._8_4_;
      terminated.field_0.i[3] = auVar41._12_4_ ^ auVar44._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar25 = 3;
      }
      else {
        uVar25 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar27 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar24 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar44 = vpcmpeqd_avx(auVar41,auVar41);
      auVar71 = ZEXT1664(auVar44);
LAB_00621532:
      paVar24 = paVar24 + -1;
      root.ptr = pNVar27[-1].ptr;
      pNVar27 = pNVar27 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_00621b3a;
      aVar73 = *paVar24;
      auVar44 = vcmpps_avx((undefined1  [16])aVar73,(undefined1  [16])tray.tfar.field_0,1);
      uVar17 = vmovmskps_avx(auVar44);
      if (uVar17 == 0) {
LAB_00621b4b:
        iVar18 = 2;
      }
      else {
        uVar26 = (ulong)(uVar17 & 0xff);
        uVar17 = POPCOUNT(uVar17 & 0xff);
        iVar18 = 0;
        if (uVar17 <= uVar25) {
          do {
            k = 0;
            for (uVar20 = uVar26; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            bVar28 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar28) {
              terminated.field_0.i[k] = -1;
            }
            uVar26 = uVar26 - 1 & uVar26;
          } while (uVar26 != 0);
          auVar44 = vpcmpeqd_avx(auVar71._0_16_,auVar71._0_16_);
          auVar71 = ZEXT1664(auVar44);
          auVar44 = auVar44 & ~(undefined1  [16])terminated.field_0;
          iVar18 = 3;
          auVar70 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar44[0xf] < '\0') {
            auVar44._8_4_ = 0xff800000;
            auVar44._0_8_ = 0xff800000ff800000;
            auVar44._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar44,
                               (undefined1  [16])terminated.field_0);
            iVar18 = 2;
          }
        }
        if (uVar25 < uVar17) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00621b3a;
              auVar44 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar73,6);
              if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar44 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar44[0xf]) goto LAB_00621b4b;
              uVar26 = (ulong)((uint)root.ptr & 0xf);
              aVar34 = terminated.field_0;
              if (uVar26 == 8) goto LAB_00621b04;
              uVar11 = *(undefined8 *)(ray + 0x50);
              auVar45 = *(undefined1 (*) [16])(ray + 0x50);
              uVar12 = *(undefined8 *)(ray + 0x60);
              uVar13 = *(undefined8 *)(ray + 0x40);
              auVar49 = *(undefined1 (*) [16])(ray + 0x40);
              lVar22 = (root.ptr & 0xfffffffffffffff0) + 0x90;
              uVar20 = 0;
              auVar44 = auVar71._0_16_ ^ (undefined1  [16])terminated.field_0;
              goto LAB_0062180b;
            }
            auVar77 = ZEXT1664(auVar70._0_16_);
            uVar26 = 0;
            uVar20 = 8;
            do {
              uVar21 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar26 * 8);
              if (uVar21 != 8) {
                uVar19 = *(undefined4 *)(root.ptr + 0x40 + uVar26 * 4);
                auVar35._4_4_ = uVar19;
                auVar35._0_4_ = uVar19;
                auVar35._8_4_ = uVar19;
                auVar35._12_4_ = uVar19;
                auVar14._4_4_ = tray.org_rdir.field_0._4_4_;
                auVar14._0_4_ = tray.org_rdir.field_0._0_4_;
                auVar14._8_4_ = tray.org_rdir.field_0._8_4_;
                auVar14._12_4_ = tray.org_rdir.field_0._12_4_;
                auVar49 = vfmsub213ps_fma(auVar35,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar14);
                uVar19 = *(undefined4 *)(root.ptr + 0x80 + uVar26 * 4);
                auVar57._4_4_ = uVar19;
                auVar57._0_4_ = uVar19;
                auVar57._8_4_ = uVar19;
                auVar57._12_4_ = uVar19;
                auVar15._4_4_ = tray.org_rdir.field_0._20_4_;
                auVar15._0_4_ = tray.org_rdir.field_0._16_4_;
                auVar15._8_4_ = tray.org_rdir.field_0._24_4_;
                auVar15._12_4_ = tray.org_rdir.field_0._28_4_;
                auVar40 = vfmsub213ps_fma(auVar57,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar15);
                uVar19 = *(undefined4 *)(root.ptr + 0xc0 + uVar26 * 4);
                auVar62._4_4_ = uVar19;
                auVar62._0_4_ = uVar19;
                auVar62._8_4_ = uVar19;
                auVar62._12_4_ = uVar19;
                auVar16._4_4_ = tray.org_rdir.field_0._36_4_;
                auVar16._0_4_ = tray.org_rdir.field_0._32_4_;
                auVar16._8_4_ = tray.org_rdir.field_0._40_4_;
                auVar16._12_4_ = tray.org_rdir.field_0._44_4_;
                auVar50 = vfmsub213ps_fma(auVar62,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar16);
                uVar19 = *(undefined4 *)(root.ptr + 0x60 + uVar26 * 4);
                auVar65._4_4_ = uVar19;
                auVar65._0_4_ = uVar19;
                auVar65._8_4_ = uVar19;
                auVar65._12_4_ = uVar19;
                auVar55 = vfmsub213ps_fma(auVar65,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar14);
                uVar19 = *(undefined4 *)(root.ptr + 0xa0 + uVar26 * 4);
                auVar51._4_4_ = uVar19;
                auVar51._0_4_ = uVar19;
                auVar51._8_4_ = uVar19;
                auVar51._12_4_ = uVar19;
                auVar56 = vfmsub213ps_fma(auVar51,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar15);
                uVar19 = *(undefined4 *)(root.ptr + 0xe0 + uVar26 * 4);
                auVar42._4_4_ = uVar19;
                auVar42._0_4_ = uVar19;
                auVar42._8_4_ = uVar19;
                auVar42._12_4_ = uVar19;
                auVar59 = vfmsub213ps_fma(auVar42,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar16);
                auVar44 = vpminsd_avx(auVar49,auVar55);
                auVar45 = vpminsd_avx(auVar40,auVar56);
                auVar44 = vpmaxsd_avx(auVar44,auVar45);
                auVar45 = vpminsd_avx(auVar50,auVar59);
                auVar45 = vpmaxsd_avx(auVar44,auVar45);
                auVar44 = vpmaxsd_avx(auVar49,auVar55);
                auVar49 = vpmaxsd_avx(auVar40,auVar56);
                auVar49 = vpminsd_avx(auVar44,auVar49);
                auVar44 = vpmaxsd_avx(auVar50,auVar59);
                auVar49 = vpminsd_avx(auVar49,auVar44);
                auVar44 = vpmaxsd_avx(auVar45,(undefined1  [16])tray.tnear.field_0);
                auVar49 = vpminsd_avx(auVar49,(undefined1  [16])tray.tfar.field_0);
                auVar44 = vcmpps_avx(auVar44,auVar49,2);
                if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar44[0xf] < '\0') {
                  auVar44 = vblendvps_avx(auVar70._0_16_,auVar45,auVar44);
                  if (uVar20 != 8) {
                    pNVar27->ptr = uVar20;
                    pNVar27 = pNVar27 + 1;
                    *paVar24 = auVar77._0_16_;
                    paVar24 = paVar24 + 1;
                  }
                  auVar77 = ZEXT1664(auVar44);
                  uVar20 = uVar21;
                }
              }
              aVar73 = auVar77._0_16_;
            } while ((uVar21 != 8) && (bVar28 = uVar26 < 7, uVar26 = uVar26 + 1, bVar28));
            iVar18 = 0;
            if (uVar20 == 8) {
LAB_00621718:
              bVar28 = false;
              iVar18 = 4;
            }
            else {
              auVar44 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar73,6);
              uVar19 = vmovmskps_avx(auVar44);
              bVar28 = true;
              if ((uint)POPCOUNT(uVar19) <= uVar25) {
                pNVar27->ptr = uVar20;
                pNVar27 = pNVar27 + 1;
                *paVar24 = aVar73;
                paVar24 = paVar24 + 1;
                goto LAB_00621718;
              }
            }
            root.ptr = uVar20;
          } while (bVar28);
        }
      }
      goto LAB_00621b3d;
    }
  }
  return;
  while( true ) {
    uVar20 = uVar20 + 1;
    lVar22 = lVar22 + 0xb0;
    auVar44 = auVar50;
    if (uVar26 - 8 <= uVar20) break;
LAB_0062180b:
    uVar21 = 0;
    auVar40 = auVar44;
    while (uVar23 = (ulong)*(uint *)(lVar22 + uVar21 * 4), uVar23 != 0xffffffff) {
      uVar19 = *(undefined4 *)(lVar22 + -0x90 + uVar21 * 4);
      auVar29._4_4_ = uVar19;
      auVar29._0_4_ = uVar19;
      auVar29._8_4_ = uVar19;
      auVar29._12_4_ = uVar19;
      auVar59 = vsubps_avx(auVar29,*(undefined1 (*) [16])ray);
      uVar19 = *(undefined4 *)(lVar22 + -0x80 + uVar21 * 4);
      auVar30._4_4_ = uVar19;
      auVar30._0_4_ = uVar19;
      auVar30._8_4_ = uVar19;
      auVar30._12_4_ = uVar19;
      auVar67 = vsubps_avx(auVar30,*(undefined1 (*) [16])(ray + 0x10));
      uVar19 = *(undefined4 *)(lVar22 + -0x70 + uVar21 * 4);
      auVar31._4_4_ = uVar19;
      auVar31._0_4_ = uVar19;
      auVar31._8_4_ = uVar19;
      auVar31._12_4_ = uVar19;
      auVar68 = vsubps_avx(auVar31,*(undefined1 (*) [16])(ray + 0x20));
      fVar1 = *(float *)(lVar22 + -0x60 + uVar21 * 4);
      auVar36._4_4_ = fVar1;
      auVar36._0_4_ = fVar1;
      auVar36._8_4_ = fVar1;
      auVar36._12_4_ = fVar1;
      fVar2 = *(float *)(lVar22 + -0x50 + uVar21 * 4);
      auVar60._4_4_ = fVar2;
      auVar60._0_4_ = fVar2;
      auVar60._8_4_ = fVar2;
      auVar60._12_4_ = fVar2;
      fVar3 = *(float *)(lVar22 + -0x40 + uVar21 * 4);
      auVar46._4_4_ = fVar3;
      auVar46._0_4_ = fVar3;
      auVar46._8_4_ = fVar3;
      auVar46._12_4_ = fVar3;
      fVar4 = *(float *)(lVar22 + -0x30 + uVar21 * 4);
      auVar69._4_4_ = fVar4;
      auVar69._0_4_ = fVar4;
      auVar69._8_4_ = fVar4;
      auVar69._12_4_ = fVar4;
      fVar5 = *(float *)(lVar22 + -0x20 + uVar21 * 4);
      auVar52._4_4_ = fVar5;
      auVar52._0_4_ = fVar5;
      auVar52._8_4_ = fVar5;
      auVar52._12_4_ = fVar5;
      fVar6 = *(float *)(lVar22 + -0x10 + uVar21 * 4);
      auVar74._4_4_ = fVar6;
      auVar74._0_4_ = fVar6;
      auVar74._8_4_ = fVar6;
      auVar74._12_4_ = fVar6;
      fVar2 = fVar6 * fVar2;
      auVar58._4_4_ = fVar2;
      auVar58._0_4_ = fVar2;
      auVar58._8_4_ = fVar2;
      auVar58._12_4_ = fVar2;
      auVar31 = vfmsub231ps_fma(auVar58,auVar52,auVar46);
      fVar4 = fVar4 * fVar3;
      auVar66._4_4_ = fVar4;
      auVar66._0_4_ = fVar4;
      auVar66._8_4_ = fVar4;
      auVar66._12_4_ = fVar4;
      auVar46 = vfmsub231ps_fma(auVar66,auVar74,auVar36);
      fVar1 = fVar1 * fVar5;
      auVar37._4_4_ = fVar1;
      auVar37._0_4_ = fVar1;
      auVar37._8_4_ = fVar1;
      auVar37._12_4_ = fVar1;
      auVar37 = vfmsub231ps_fma(auVar37,auVar69,auVar60);
      auVar61._0_4_ = (float)uVar11 * auVar68._0_4_;
      auVar61._4_4_ = (float)((ulong)uVar11 >> 0x20) * auVar68._4_4_;
      auVar61._8_4_ = (float)*(undefined8 *)(ray + 0x58) * auVar68._8_4_;
      auVar61._12_4_ = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20) * auVar68._12_4_;
      auVar58 = vfmsub231ps_fma(auVar61,auVar67,*(undefined1 (*) [16])(ray + 0x60));
      fVar1 = (float)uVar12;
      auVar63._0_4_ = auVar59._0_4_ * fVar1;
      fVar2 = (float)((ulong)uVar12 >> 0x20);
      auVar63._4_4_ = auVar59._4_4_ * fVar2;
      fVar4 = (float)*(undefined8 *)(ray + 0x68);
      auVar63._8_4_ = auVar59._8_4_ * fVar4;
      fVar5 = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      auVar63._12_4_ = auVar59._12_4_ * fVar5;
      auVar61 = vfmsub231ps_fma(auVar63,auVar68,auVar49);
      auVar64._0_4_ = (float)uVar13 * auVar67._0_4_;
      auVar64._4_4_ = (float)((ulong)uVar13 >> 0x20) * auVar67._4_4_;
      auVar64._8_4_ = (float)*(undefined8 *)(ray + 0x48) * auVar67._8_4_;
      auVar64._12_4_ = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20) * auVar67._12_4_;
      auVar63 = vfmsub231ps_fma(auVar64,auVar59,auVar45);
      auVar32._0_4_ = auVar37._0_4_ * fVar1;
      auVar32._4_4_ = auVar37._4_4_ * fVar2;
      auVar32._8_4_ = auVar37._8_4_ * fVar4;
      auVar32._12_4_ = auVar37._12_4_ * fVar5;
      auVar50 = vfmadd231ps_fma(auVar32,auVar46,auVar45);
      auVar30 = vfmadd231ps_fma(auVar50,auVar31,auVar49);
      auVar75._0_4_ = fVar6 * auVar63._0_4_;
      auVar75._4_4_ = fVar6 * auVar63._4_4_;
      auVar75._8_4_ = fVar6 * auVar63._8_4_;
      auVar75._12_4_ = fVar6 * auVar63._12_4_;
      auVar55 = vfmadd231ps_fma(auVar75,auVar61,auVar52);
      auVar53._8_4_ = 0x80000000;
      auVar53._0_8_ = 0x8000000080000000;
      auVar53._12_4_ = 0x80000000;
      auVar50 = vandps_avx(auVar30,auVar53);
      auVar55 = vfmadd231ps_fma(auVar55,auVar58,auVar69);
      uVar17 = auVar50._0_4_;
      auVar76._0_4_ = auVar55._0_4_ ^ uVar17;
      uVar8 = auVar50._4_4_;
      auVar76._4_4_ = auVar55._4_4_ ^ uVar8;
      uVar9 = auVar50._8_4_;
      auVar76._8_4_ = auVar55._8_4_ ^ uVar9;
      uVar10 = auVar50._12_4_;
      auVar76._12_4_ = auVar55._12_4_ ^ uVar10;
      auVar32 = ZEXT816(0) << 0x20;
      auVar56 = vcmpps_avx(auVar76,auVar32,5);
      auVar29 = auVar40 & auVar56;
      auVar50 = auVar59;
      auVar55 = auVar7;
      if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar29[0xf] < '\0'
         ) {
        auVar50 = vandps_avx(auVar56,auVar40);
        auVar47._0_4_ = auVar63._0_4_ * fVar3;
        auVar47._4_4_ = auVar63._4_4_ * fVar3;
        auVar47._8_4_ = auVar63._8_4_ * fVar3;
        auVar47._12_4_ = auVar63._12_4_ * fVar3;
        auVar56 = vfmadd132ps_fma(auVar61,auVar47,auVar60);
        auVar56 = vfmadd132ps_fma(auVar58,auVar56,auVar36);
        auVar48._0_4_ = uVar17 ^ auVar56._0_4_;
        auVar48._4_4_ = uVar8 ^ auVar56._4_4_;
        auVar48._8_4_ = uVar9 ^ auVar56._8_4_;
        auVar48._12_4_ = uVar10 ^ auVar56._12_4_;
        auVar56 = vcmpps_avx(auVar48,auVar32,5);
        auVar29 = auVar50 & auVar56;
        if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar29[0xf] < '\0') {
          auVar29 = vandps_avx(auVar30,auVar72);
          auVar56 = vandps_avx(auVar50,auVar56);
          auVar58 = vsubps_avx(auVar29,auVar76);
          auVar58 = vcmpps_avx(auVar58,auVar48,5);
          auVar61 = auVar56 & auVar58;
          if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar61[0xf] < '\0') {
            auVar56 = vandps_avx(auVar58,auVar56);
            auVar38._0_4_ = auVar37._0_4_ * auVar68._0_4_;
            auVar38._4_4_ = auVar37._4_4_ * auVar68._4_4_;
            auVar38._8_4_ = auVar37._8_4_ * auVar68._8_4_;
            auVar38._12_4_ = auVar37._12_4_ * auVar68._12_4_;
            auVar67 = vfmadd213ps_fma(auVar67,auVar46,auVar38);
            auVar59 = vfmadd213ps_fma(auVar59,auVar31,auVar67);
            auVar39._0_4_ = uVar17 ^ auVar59._0_4_;
            auVar39._4_4_ = uVar8 ^ auVar59._4_4_;
            auVar39._8_4_ = uVar9 ^ auVar59._8_4_;
            auVar39._12_4_ = uVar10 ^ auVar59._12_4_;
            local_36e8 = (float)*(undefined8 *)(ray + 0x30);
            fStack_36e4 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
            fStack_36e0 = (float)*(undefined8 *)(ray + 0x38);
            fStack_36dc = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
            auVar54._0_4_ = auVar29._0_4_ * local_36e8;
            auVar54._4_4_ = auVar29._4_4_ * fStack_36e4;
            auVar54._8_4_ = auVar29._8_4_ * fStack_36e0;
            auVar54._12_4_ = auVar29._12_4_ * fStack_36dc;
            auVar59 = vcmpps_avx(auVar54,auVar39,1);
            local_36f8 = (float)*(undefined8 *)(ray + 0x80);
            fStack_36f4 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
            fStack_36f0 = (float)*(undefined8 *)(ray + 0x88);
            fStack_36ec = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
            auVar43._0_4_ = auVar29._0_4_ * local_36f8;
            auVar43._4_4_ = auVar29._4_4_ * fStack_36f4;
            auVar43._8_4_ = auVar29._8_4_ * fStack_36f0;
            auVar43._12_4_ = auVar29._12_4_ * fStack_36ec;
            auVar67 = vcmpps_avx(auVar39,auVar43,2);
            auVar59 = vandps_avx(auVar67,auVar59);
            auVar67 = auVar56 & auVar59;
            if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar67[0xf] < '\0') {
              auVar56 = vandps_avx(auVar59,auVar56);
              auVar59 = vcmpps_avx(auVar32,auVar30,4);
              auVar67 = auVar56 & auVar59;
              if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar67[0xf] < '\0') {
                auVar55 = vandps_avx(auVar59,auVar56);
              }
            }
          }
        }
      }
      uVar17 = ((context->scene->geometries).items[uVar23].ptr)->mask;
      auVar33._4_4_ = uVar17;
      auVar33._0_4_ = uVar17;
      auVar33._8_4_ = uVar17;
      auVar33._12_4_ = uVar17;
      auVar56 = vpand_avx(auVar33,*(undefined1 (*) [16])(ray + 0x90));
      auVar56 = vpcmpeqd_avx(auVar32,auVar56);
      auVar59 = auVar55 & ~auVar56;
      if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar59[0xf])
      {
        auVar50 = vpcmpeqd_avx(auVar50,auVar50);
      }
      else {
        auVar55 = vandnps_avx(auVar56,auVar55);
        auVar40 = vandnps_avx(auVar55,auVar40);
        auVar50 = vpcmpeqd_avx(auVar50,auVar50);
      }
      auVar71 = ZEXT1664(auVar50);
      auVar70 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      if (((((auVar40 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar40 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar40[0xf])
         || (bVar28 = 2 < uVar21, uVar21 = uVar21 + 1, bVar28)) break;
    }
    auVar50 = vpand_avx(auVar40,auVar44);
    auVar40 = auVar40 & auVar44;
    if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar40 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar40[0xf])
    break;
  }
  aVar34 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar71._0_16_ ^ auVar50);
LAB_00621b04:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar34);
  auVar44 = auVar71._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar44 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar44[0xf]) {
LAB_00621b3a:
    iVar18 = 3;
  }
  else {
    auVar40._8_4_ = 0xff800000;
    auVar40._0_8_ = 0xff800000ff800000;
    auVar40._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar40,
                       (undefined1  [16])terminated.field_0);
    iVar18 = 0;
  }
LAB_00621b3d:
  if (iVar18 == 3) {
    auVar7 = vandps_avx(auVar41,(undefined1  [16])terminated.field_0);
    auVar41._8_4_ = 0xff800000;
    auVar41._0_8_ = 0xff800000ff800000;
    auVar41._12_4_ = 0xff800000;
    auVar7 = vmaskmovps_avx(auVar7,auVar41);
    *(undefined1 (*) [16])(ray + 0x80) = auVar7;
    return;
  }
  goto LAB_00621532;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }